

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcExpand.c
# Opt level: O0

int Abc_ObjExpandCubesTry(Vec_Str_t *vSop,sat_solver *pSat,Vec_Int_t *vVars)

{
  int iVar1;
  int nCap;
  int iVar2;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int local_4c;
  int Entry;
  int k;
  Vec_Int_t *vTemp;
  Vec_Int_t *vLits;
  int nVars;
  int nCubes;
  char *pSop;
  char *pCube;
  Vec_Int_t *vVars_local;
  sat_solver *pSat_local;
  Vec_Str_t *vSop_local;
  
  pSop = Vec_StrArray(vSop);
  iVar1 = Abc_SopGetCubeNum(pSop);
  nCap = Abc_SopGetVarNum(pSop);
  p = Vec_IntAlloc(nCap);
  p_00 = Vec_IntAlloc(nCap);
  iVar2 = Vec_IntSize(vVars);
  if (nCap != iVar2) {
    __assert_fail("nVars == Vec_IntSize(vVars)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcExpand.c"
                  ,0x40,"int Abc_ObjExpandCubesTry(Vec_Str_t *, sat_solver *, Vec_Int_t *)");
  }
  iVar2 = Vec_StrSize(vSop);
  if (iVar2 == iVar1 * (nCap + 3) + 1) {
    for (; *pSop != '\0'; pSop = pSop + (nCap + 3)) {
      Vec_IntFill(p,nCap,-1);
      for (local_4c = 0; local_4c < nCap; local_4c = local_4c + 1) {
        if (pSop[local_4c] != '-') {
          iVar2 = Vec_IntEntry(vVars,local_4c);
          iVar2 = Abc_Var2Lit(iVar2,(uint)(pSop[local_4c] == '0'));
          Vec_IntWriteEntry(p,local_4c,iVar2);
          pSop[local_4c] = '-';
        }
      }
      Bmc_CollapseExpandRound(pSat,(sat_solver *)0x0,p,(Vec_Int_t *)0x0,p_00,0,0,-1);
      for (local_4c = 0; iVar2 = Vec_IntSize(p), local_4c < iVar2; local_4c = local_4c + 1) {
        iVar2 = Vec_IntEntry(p,local_4c);
        if (iVar2 != -1) {
          iVar2 = Abc_LitIsCompl(iVar2);
          pSop[local_4c] = '1' - (char)iVar2;
        }
      }
    }
    Vec_IntFree(p);
    Vec_IntFree(p_00);
    return iVar1;
  }
  __assert_fail("Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcExpand.c"
                ,0x41,"int Abc_ObjExpandCubesTry(Vec_Str_t *, sat_solver *, Vec_Int_t *)");
}

Assistant:

int Abc_ObjExpandCubesTry( Vec_Str_t * vSop, sat_solver * pSat, Vec_Int_t * vVars )
{
    extern int Bmc_CollapseExpandRound( sat_solver * pSat, sat_solver * pSatOn, Vec_Int_t * vLits, Vec_Int_t * vNums, Vec_Int_t * vTemp, int nBTLimit, int fCanon, int fOnOffSetLit );

    char * pCube, * pSop = Vec_StrArray(vSop);
    int nCubes = Abc_SopGetCubeNum(pSop);
    int nVars = Abc_SopGetVarNum(pSop);

    Vec_Int_t * vLits = Vec_IntAlloc( nVars );
    Vec_Int_t * vTemp = Vec_IntAlloc( nVars );

    assert( nVars == Vec_IntSize(vVars) );
    assert( Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1 );
    Bmc_SopForEachCube( pSop, nVars, pCube )
    {
        int k, Entry;
        // collect literals and clean cube
        Vec_IntFill( vLits, nVars, -1 );
        for ( k = 0; k < nVars; k++ )
        {
            if ( pCube[k] == '-' )
                continue;
            Vec_IntWriteEntry( vLits, k, Abc_Var2Lit(Vec_IntEntry(vVars, k), pCube[k] == '0') );
            pCube[k] = '-';
        }
        // expand cube
        Bmc_CollapseExpandRound( pSat, NULL, vLits, NULL, vTemp, 0, 0, -1 );
        // insert literals
        Vec_IntForEachEntry( vLits, Entry, k )
            if ( Entry != -1 )
                pCube[k] = '1' - Abc_LitIsCompl(Entry);
    }

    Vec_IntFree( vLits );
    Vec_IntFree( vTemp );
    return nCubes;
}